

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCache.c
# Opt level: O3

void If_ManCacheAnalize(If_Man_t *p)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  Vec_Int_t *p_00;
  int *piVar11;
  void *pvVar12;
  uint *__ptr;
  void *pvVar13;
  int *piVar14;
  uint *puVar15;
  long lVar16;
  undefined8 *puVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  Vec_Int_t *vTest [32];
  uint local_158;
  uint local_154;
  long alStack_138 [33];
  
  pVVar4 = p->vCutData;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar11 = (int *)malloc(400);
  p_00->pArray = piVar11;
  uVar8 = pVVar4->nSize;
  uVar24 = uVar8 + 3;
  if (-1 < (int)uVar8) {
    uVar24 = uVar8;
  }
  if ((uVar8 & 3) != 0) {
    __assert_fail("Vec_IntSize(vData) % nSize == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                  ,0x162,"Vec_Int_t *Hsh_IntManHashArray(Vec_Int_t *, int)");
  }
  uVar24 = (int)uVar24 >> 2;
  uVar23 = (ulong)(uVar24 - 1);
  while( true ) {
    do {
      uVar27 = (uint)uVar23;
      uVar26 = uVar27 + 1;
      uVar19 = (ulong)uVar26;
      uVar25 = uVar23 & 1;
      uVar23 = uVar19;
    } while (uVar25 != 0);
    if (uVar26 < 9) break;
    iVar20 = 5;
    while (uVar26 % (iVar20 - 2U) != 0) {
      uVar7 = iVar20 * iVar20;
      iVar20 = iVar20 + 2;
      if (uVar26 < uVar7) goto LAB_008b9ef9;
    }
  }
LAB_008b9ef9:
  local_158 = uVar26;
  if (uVar27 < 0xf) {
    local_158 = 0x10;
  }
  pvVar12 = malloc((long)(int)local_158 << 2);
  if (pvVar12 != (void *)0x0) {
    memset(pvVar12,0xff,(long)(int)uVar26 << 2);
  }
  __ptr = (uint *)malloc(0x10);
  uVar27 = 0x10;
  if (0xe < uVar24 - 1) {
    uVar27 = uVar24;
  }
  __ptr[1] = 0;
  *__ptr = uVar27;
  if (uVar27 == 0) {
    pvVar13 = (void *)0x0;
  }
  else {
    pvVar13 = malloc((long)(int)uVar27 << 3);
  }
  *(void **)(__ptr + 2) = pvVar13;
  if (3 < (int)uVar8) {
    lVar16 = 0;
    uVar25 = 0;
    uVar23 = 0;
    do {
      local_154 = (uint)uVar23;
      if ((int)uVar19 < (int)local_154) {
        uVar21 = (ulong)((int)uVar19 * 2 - 1);
        while( true ) {
          do {
            uVar8 = (uint)uVar21;
            uVar27 = uVar8 + 1;
            uVar19 = (ulong)uVar27;
            uVar6 = uVar21 & 1;
            uVar21 = uVar19;
          } while (uVar6 != 0);
          if (uVar27 < 9) break;
          iVar20 = 5;
          while (uVar27 % (iVar20 - 2U) != 0) {
            uVar26 = iVar20 * iVar20;
            iVar20 = iVar20 + 2;
            if (uVar27 < uVar26) goto LAB_008b9fdc;
          }
        }
LAB_008b9fdc:
        if ((int)local_158 < (int)uVar27) {
          if (pvVar12 == (void *)0x0) {
            pvVar12 = malloc((long)(int)uVar27 << 2);
          }
          else {
            pvVar12 = realloc(pvVar12,(long)(int)uVar27 << 2);
          }
          local_158 = uVar27;
          if (pvVar12 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
        }
        if (uVar8 < 0x7fffffff) {
          memset(pvVar12,0xff,uVar19 << 2);
        }
        if (0 < (int)local_154) {
          uVar21 = 0;
          do {
            iVar20 = *(int *)((long)pvVar13 + uVar21 * 8);
            if ((iVar20 < 0) || (uVar8 = iVar20 * 4, pVVar4->nSize <= (int)uVar8))
            goto LAB_008ba5d2;
            lVar18 = 0;
            uVar26 = 0;
            do {
              lVar22 = lVar18 + (ulong)uVar8 * 4;
              lVar18 = lVar18 + 1;
              uVar26 = (*(byte *)((long)pVVar4->pArray + lVar22) + uVar26) * 0x401;
              uVar26 = uVar26 >> 6 ^ uVar26;
            } while (lVar18 != 0x10);
            uVar6 = (ulong)((uVar26 * 9 >> 0xb ^ uVar26 * 9) * 0x8001) % uVar19;
            if (((int)uVar6 < 0) || ((int)uVar27 <= (int)uVar6)) goto LAB_008ba5d2;
            *(undefined4 *)((long)pvVar13 + uVar21 * 8 + 4) =
                 *(undefined4 *)((long)pvVar12 + uVar6 * 4);
            *(int *)((long)pvVar12 + uVar6 * 4) = (int)uVar21;
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar23);
        }
      }
      if ((long)pVVar4->nSize <= (long)(uVar25 * 4)) {
LAB_008ba5d2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar11 = pVVar4->pArray;
      lVar18 = 0;
      uVar8 = 0;
      do {
        lVar22 = lVar18 + lVar16;
        lVar18 = lVar18 + 1;
        uVar8 = (*(byte *)((long)piVar11 + lVar22) + uVar8) * 0x401;
        uVar8 = uVar8 >> 6 ^ uVar8;
      } while (lVar18 != 0x10);
      uVar21 = (ulong)((uVar8 * 9 >> 0xb ^ uVar8 * 9) * 0x8001) % uVar19;
      if (((int)uVar21 < 0) || ((int)uVar19 <= (int)uVar21)) goto LAB_008ba5d2;
      uVar8 = *(uint *)((long)pvVar12 + uVar21 * 4);
      if (uVar8 == 0xffffffff) {
        puVar15 = (uint *)(uVar21 * 4 + (long)pvVar12);
      }
      else {
        do {
          uVar21 = (ulong)uVar8;
          if (((int)uVar8 < 0) || ((int)local_154 <= (int)uVar8)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          if (pvVar13 == (void *)0x0) {
            __assert_fail("*pPlace == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                          ,0x138,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
          }
          piVar14 = (int *)(uVar21 * 8 + (long)pvVar13);
          if ((*piVar14 < 0) || (uVar8 = *piVar14 * 4, pVVar4->nSize <= (int)uVar8))
          goto LAB_008ba5d2;
          piVar1 = piVar11 + uVar25 * 4;
          piVar2 = piVar11 + uVar8;
          auVar28[0] = -((char)*piVar2 == (char)*piVar1);
          auVar28[1] = -(*(char *)((long)piVar2 + 1) == *(char *)((long)piVar1 + 1));
          auVar28[2] = -(*(char *)((long)piVar2 + 2) == *(char *)((long)piVar1 + 2));
          auVar28[3] = -(*(char *)((long)piVar2 + 3) == *(char *)((long)piVar1 + 3));
          auVar28[4] = -((char)piVar2[1] == (char)piVar1[1]);
          auVar28[5] = -(*(char *)((long)piVar2 + 5) == *(char *)((long)piVar1 + 5));
          auVar28[6] = -(*(char *)((long)piVar2 + 6) == *(char *)((long)piVar1 + 6));
          auVar28[7] = -(*(char *)((long)piVar2 + 7) == *(char *)((long)piVar1 + 7));
          auVar28[8] = -((char)piVar2[2] == (char)piVar1[2]);
          auVar28[9] = -(*(char *)((long)piVar2 + 9) == *(char *)((long)piVar1 + 9));
          auVar28[10] = -(*(char *)((long)piVar2 + 10) == *(char *)((long)piVar1 + 10));
          auVar28[0xb] = -(*(char *)((long)piVar2 + 0xb) == *(char *)((long)piVar1 + 0xb));
          auVar28[0xc] = -((char)piVar2[3] == (char)piVar1[3]);
          auVar28[0xd] = -(*(char *)((long)piVar2 + 0xd) == *(char *)((long)piVar1 + 0xd));
          auVar28[0xe] = -(*(char *)((long)piVar2 + 0xe) == *(char *)((long)piVar1 + 0xe));
          auVar28[0xf] = -(*(char *)((long)piVar2 + 0xf) == *(char *)((long)piVar1 + 0xf));
          if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar28[0xf] >> 7) << 0xf) == 0xffff) goto LAB_008ba288;
          uVar8 = piVar14[1];
        } while (uVar8 != 0xffffffff);
        puVar15 = (uint *)(piVar14 + 1);
      }
      *puVar15 = local_154;
      if (local_154 == *__ptr) {
        if ((int)local_154 < 0x10) {
          if (pvVar13 == (void *)0x0) {
            pvVar13 = malloc(0x80);
          }
          else {
            pvVar13 = realloc(pvVar13,0x80);
          }
          *(void **)(__ptr + 2) = pvVar13;
          uVar8 = 0x10;
        }
        else {
          uVar8 = local_154 * 2;
          if (pvVar13 == (void *)0x0) {
            pvVar13 = malloc((ulong)uVar8 * 8);
          }
          else {
            pvVar13 = realloc(pvVar13,(ulong)uVar8 * 8);
          }
          *(void **)(__ptr + 2) = pvVar13;
        }
        if (pvVar13 == (void *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        *__ptr = uVar8;
      }
      *(ulong *)((long)pvVar13 + (long)(int)local_154 * 8) = uVar25 | 0xffffffff00000000;
      uVar21 = uVar23;
      uVar23 = (ulong)(local_154 + 1);
      local_154 = local_154 + 1;
LAB_008ba288:
      Vec_IntPush(p_00,(int)uVar21);
      uVar25 = uVar25 + 1;
      lVar16 = lVar16 + 0x10;
    } while (uVar25 != uVar24);
    __ptr[1] = local_154;
  }
  if (pvVar12 != (void *)0x0) {
    free(pvVar12);
    pvVar13 = *(void **)(__ptr + 2);
  }
  if (pvVar13 != (void *)0x0) {
    free(pvVar13);
  }
  free(__ptr);
  uVar8 = p->pPars->nLutSize;
  if (-1 < (int)uVar8) {
    lVar16 = 0;
    do {
      puVar17 = (undefined8 *)malloc(0x10);
      *puVar17 = 1000;
      pvVar12 = malloc(4000);
      puVar17[1] = pvVar12;
      alStack_138[lVar16] = (long)puVar17;
      lVar16 = lVar16 + 1;
    } while ((ulong)uVar8 + 1 != lVar16);
  }
  iVar20 = p_00->nSize;
  lVar16 = (long)iVar20;
  if (0 < lVar16) {
    piVar11 = p_00->pArray;
    lVar18 = 0;
    do {
      if ((long)p->vCutData->nSize <= lVar18 + 2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush((Vec_Int_t *)alStack_138[p->vCutData->pArray[lVar18 + 2]],
                  *(int *)((long)piVar11 + lVar18));
      lVar18 = lVar18 + 4;
    } while (lVar16 * 4 - lVar18 != 0);
    uVar8 = p->pPars->nLutSize;
  }
  if (-1 < (int)uVar8) {
    iVar9 = 1;
    if (1 < iVar20) {
      iVar9 = iVar20;
    }
    uVar23 = 0;
    do {
      lVar18 = alStack_138[uVar23];
      uVar8 = *(uint *)(lVar18 + 4);
      uVar25 = (ulong)uVar8;
      iVar10 = 0;
      if (uVar25 != 0) {
        iVar10 = **(int **)(lVar18 + 8);
        if (1 < (int)uVar8) {
          uVar19 = 1;
          do {
            iVar3 = (*(int **)(lVar18 + 8))[uVar19];
            if (iVar10 <= iVar3) {
              iVar10 = iVar3;
            }
            uVar19 = uVar19 + 1;
          } while (uVar25 != uVar19);
        }
      }
      pvVar12 = calloc((long)(iVar10 + 1),1);
      if ((int)uVar8 < 1) {
        uVar19 = 0;
        if (pvVar12 != (void *)0x0) goto LAB_008ba42d;
      }
      else {
        lVar18 = *(long *)(lVar18 + 8);
        uVar21 = 0;
        uVar19 = 0;
        do {
          lVar22 = (long)*(int *)(lVar18 + uVar21 * 4);
          if (*(char *)((long)pvVar12 + lVar22) == '\0') {
            *(undefined1 *)((long)pvVar12 + lVar22) = 1;
            uVar19 = (ulong)((int)uVar19 + 1);
          }
          uVar21 = uVar21 + 1;
        } while (uVar25 != uVar21);
LAB_008ba42d:
        free(pvVar12);
      }
      uVar24 = 1;
      if (1 < (int)uVar8) {
        uVar24 = uVar8;
      }
      printf("%2d-var entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n",
             ((double)(int)uVar8 * 100.0) / (double)iVar9,
             ((double)(int)uVar19 * 100.0) / (double)(int)uVar24,uVar23 & 0xffffffff,uVar25,uVar19);
      iVar10 = p->pPars->nLutSize;
      bVar5 = (long)uVar23 < (long)iVar10;
      uVar23 = uVar23 + 1;
    } while (bVar5);
    if (-1 < iVar10) {
      lVar18 = -1;
      do {
        pvVar12 = (void *)alStack_138[lVar18 + 1];
        pvVar13 = *(void **)((long)pvVar12 + 8);
        if (pvVar13 != (void *)0x0) {
          free(pvVar13);
        }
        free(pvVar12);
        lVar18 = lVar18 + 1;
      } while (lVar18 < p->pPars->nLutSize);
    }
  }
  if (iVar20 == 0) {
    pvVar12 = calloc(1,1);
LAB_008ba547:
    uVar8 = 0;
    if (pvVar12 == (void *)0x0) goto LAB_008ba556;
  }
  else {
    iVar9 = *p_00->pArray;
    if (1 < iVar20) {
      lVar18 = 1;
      do {
        iVar10 = p_00->pArray[lVar18];
        if (iVar9 <= iVar10) {
          iVar9 = iVar10;
        }
        lVar18 = lVar18 + 1;
      } while (lVar16 != lVar18);
    }
    pvVar12 = calloc((long)(iVar9 + 1),1);
    if (iVar20 < 1) goto LAB_008ba547;
    piVar11 = p_00->pArray;
    lVar18 = 0;
    uVar8 = 0;
    do {
      if (*(char *)((long)pvVar12 + (long)piVar11[lVar18]) == '\0') {
        *(undefined1 *)((long)pvVar12 + (long)piVar11[lVar18]) = 1;
        uVar8 = uVar8 + 1;
      }
      lVar18 = lVar18 + 1;
    } while (lVar16 != lVar18);
  }
  free(pvVar12);
LAB_008ba556:
  iVar20 = p->vCutData->nSize;
  iVar9 = iVar20 + 3;
  if (-1 < iVar20) {
    iVar9 = iVar20;
  }
  uVar27 = iVar9 >> 2;
  uVar24 = 1;
  if (1 < (int)uVar27) {
    uVar24 = uVar27;
  }
  printf("Total  entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n",0x4059000000000000,
         ((double)(int)uVar8 * 100.0) / (double)(int)uVar24,(ulong)uVar27,(ulong)uVar8);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return;
}

Assistant:

void If_ManCacheAnalize( If_Man_t * p )
{
    Vec_Int_t * vRes, * vTest[32];
    int i, Entry, uUnique;
    vRes = Hsh_IntManHashArray( p->vCutData, 4 );
    for ( i = 0; i <= p->pPars->nLutSize; i++ )
        vTest[i] = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vRes, Entry, i )
        Vec_IntPush( vTest[Vec_IntEntry(p->vCutData, 4*i+2)], Entry );
    for ( i = 0; i <= p->pPars->nLutSize; i++ )
    {
        uUnique = Vec_IntCountUnique(vTest[i]);
        printf( "%2d-var entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n", 
            i, Vec_IntSize(vTest[i]), 100.0*Vec_IntSize(vTest[i])/Abc_MaxInt(1, Vec_IntSize(vRes)), 
            uUnique, 100.0*uUnique/Abc_MaxInt(1, Vec_IntSize(vTest[i])) );
    }
    for ( i = 0; i <= p->pPars->nLutSize; i++ )
        Vec_IntFree( vTest[i] );
    uUnique = Vec_IntCountUnique(vRes);
    printf( "Total  entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n", 
        Vec_IntSize(p->vCutData)/4, 100.0, uUnique, 100.0*uUnique/Abc_MaxInt(1, Vec_IntSize(p->vCutData)/4) );
    Vec_IntFree( vRes );
}